

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsum.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (argc == 1) {
    fwrite("Error: need arguments\n",0x16,1,_stderr);
    fwrite("Usage: dsum SignalSeries1 [SignalSeries2 ...]\n",0x2e,1,_stderr);
    iVar5 = 1;
  }
  else {
    uVar7 = (ulong)(argc - 1U);
    uVar6 = 0xffffffffffffffff;
    if (0 < argc) {
      uVar6 = uVar7 * 8;
    }
    pvVar3 = operator_new__(uVar6);
    NaOpenLogFile("dsum.log");
    if ((int)(argc - 1U) < 1) {
      uVar7 = 0;
    }
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      plVar4 = (long *)OpenInputDataFile(argv[uVar6 + 1]);
      *(long **)((long)pvVar3 + uVar6 * 8) = plVar4;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x28))(plVar4);
      }
    }
    uVar6 = 0;
    bVar2 = 0;
    do {
      for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
        plVar4 = *(long **)((long)pvVar3 + uVar6 * 8);
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x18))(plVar4,0);
          bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4);
          bVar2 = bVar1 ^ 1 | bVar2;
        }
      }
      printf("%g\n");
      uVar6 = 0;
      bVar1 = bVar2 & 1;
      bVar2 = 0;
    } while (bVar1 == 0);
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      plVar4 = *(long **)((long)pvVar3 + uVar6 * 8);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
    operator_delete(pvVar3,8);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc == 1)
    {
      fprintf(stderr, "Error: need arguments\n");
      fprintf(stderr, "Usage: dsum SignalSeries1 [SignalSeries2 ...]\n");
      return 1;
    }

  int		i, n = argc - 1;
  NaDataFile	**dfSeries = new NaDataFile*[n];

  NaOpenLogFile("dsum.log");

  for(i = 0; i < n; ++i)
    {
      try{
	dfSeries[i] = OpenInputDataFile(argv[1+i]);
	if(NULL != dfSeries[i])
	  dfSeries[i]->GoStartRecord();
      }
      catch(NaException& ex){
	NaPrintLog("Failed to open '%s' due to %s\n",
		   argv[1+i], NaExceptionMsg(ex));
	dfSeries[i] = NULL;
      }
    }

  try{
    NaReal	fSum;
    bool	bEOF = false;
    do{
      fSum = 0.0;

      for(i = 0; i < n; ++i)
	if(NULL != dfSeries[i])
	  {
	    fSum += dfSeries[i]->GetValue();
	    if(!dfSeries[i]->GoNextRecord())
	      bEOF = true;
	  }

      printf("%g\n", fSum);

    }while(!bEOF);

    for(i = 0; i < n; ++i)
      delete dfSeries[i];

    delete dfSeries;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}